

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O0

Result<std::vector<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>_> * __thiscall
vkb::PhysicalDeviceSelector::select_devices
          (Result<std::vector<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>_>
           *__return_storage_ptr__,PhysicalDeviceSelector *this)

{
  bool bVar1;
  vector<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_> *pvVar2;
  size_type sVar3;
  error_code eVar4;
  error_code error_code;
  error_code local_70;
  undefined4 local_5c;
  uint local_58;
  error_category *local_50;
  undefined1 local_38 [8];
  Result<std::vector<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>_> selected_devices;
  PhysicalDeviceSelector *this_local;
  
  selected_devices._24_8_ = this;
  select_impl((Result<std::vector<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>_> *)
              local_38,this);
  bVar1 = vkb::Result::operator_cast_to_bool((Result *)local_38);
  if (bVar1) {
    pvVar2 = Result<std::vector<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>_>::value
                       ((Result<std::vector<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>_>
                         *)local_38);
    sVar3 = std::vector<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>::size(pvVar2);
    if (sVar3 == 0) {
      std::error_code::error_code<vkb::PhysicalDeviceError,void>(&local_70,no_suitable_device);
      eVar4._4_4_ = 0;
      eVar4._M_value = local_70._M_value;
      eVar4._M_cat = local_70._M_cat;
      Result<std::vector<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>_>::Result
                (__return_storage_ptr__,eVar4,VK_SUCCESS);
    }
    else {
      pvVar2 = Result<std::vector<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>_>::
               value((Result<std::vector<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>_>
                      *)local_38);
      Result<std::vector<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>_>::Result
                (__return_storage_ptr__,pvVar2);
    }
  }
  else {
    eVar4 = Result<std::vector<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>_>::error
                      ((Result<std::vector<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>_>
                        *)local_38);
    error_code._M_cat = eVar4._M_cat;
    local_58 = eVar4._M_value;
    error_code._4_4_ = 0;
    error_code._M_value = local_58;
    local_50 = error_code._M_cat;
    Result<std::vector<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>_>::Result
              (__return_storage_ptr__,error_code,VK_SUCCESS);
  }
  local_5c = 1;
  Result<std::vector<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>_>::~Result
            ((Result<std::vector<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>_> *)
             local_38);
  return __return_storage_ptr__;
}

Assistant:

Result<std::vector<PhysicalDevice>> PhysicalDeviceSelector::select_devices() const {
    auto const selected_devices = select_impl();
    if (!selected_devices) return Result<std::vector<PhysicalDevice>>{ selected_devices.error() };
    if (selected_devices.value().size() == 0) {
        return Result<std::vector<PhysicalDevice>>{ PhysicalDeviceError::no_suitable_device };
    }
    return selected_devices.value();
}